

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O0

cmCommand * __thiscall cmCTestSubdirCommand::Clone(cmCTestSubdirCommand *this)

{
  cmCTestSubdirCommand *this_00;
  cmCTestSubdirCommand *c;
  cmCTestSubdirCommand *this_local;
  
  this_00 = (cmCTestSubdirCommand *)operator_new(0x58);
  cmCTestSubdirCommand(this_00);
  this_00->TestHandler = this->TestHandler;
  return &this_00->super_cmCommand;
}

Assistant:

virtual cmCommand* Clone()
    {
    cmCTestSubdirCommand* c = new cmCTestSubdirCommand;
    c->TestHandler = this->TestHandler;
    return c;
    }